

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O1

c_v256 * c_v256_min_s32(c_v256 a,c_v256 b)

{
  c_v128 cVar1;
  c_v128 cVar2;
  c_v256 *in_RDI;
  
  cVar1 = (c_v128)vpminsd_avx((undefined1  [16])a.v128[1],(undefined1  [16])b.v128[1]);
  cVar2 = (c_v128)vpminsd_avx((undefined1  [16])a.v128[0],(undefined1  [16])b.v128[0]);
  in_RDI->v128[1] = cVar1;
  in_RDI->v128[0] = cVar2;
  return in_RDI;
}

Assistant:

SIMD_INLINE c_v256 c_v256_min_s32(c_v256 a, c_v256 b) {
  return c_v256_from_v128(c_v128_min_s32(a.v128[1], b.v128[1]),
                          c_v128_min_s32(a.v128[0], b.v128[0]));
}